

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O3

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::AddAndOwn
          (SimpleDescriptorDatabase *this,FileDescriptorProto *file)

{
  pointer *ppuVar1;
  iterator __position;
  bool bVar2;
  FileDescriptorProto *local_18;
  
  __position._M_current =
       (this->files_to_delete_).
       super__Vector_base<std::unique_ptr<const_google::protobuf::FileDescriptorProto,_std::default_delete<const_google::protobuf::FileDescriptorProto>_>,_std::allocator<std::unique_ptr<const_google::protobuf::FileDescriptorProto,_std::default_delete<const_google::protobuf::FileDescriptorProto>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_18 = file;
  if (__position._M_current ==
      (this->files_to_delete_).
      super__Vector_base<std::unique_ptr<const_google::protobuf::FileDescriptorProto,_std::default_delete<const_google::protobuf::FileDescriptorProto>_>,_std::allocator<std::unique_ptr<const_google::protobuf::FileDescriptorProto,_std::default_delete<const_google::protobuf::FileDescriptorProto>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<std::unique_ptr<google::protobuf::FileDescriptorProto_const,std::default_delete<google::protobuf::FileDescriptorProto_const>>,std::allocator<std::unique_ptr<google::protobuf::FileDescriptorProto_const,std::default_delete<google::protobuf::FileDescriptorProto_const>>>>
    ::_M_realloc_insert<google::protobuf::FileDescriptorProto_const*&>
              ((vector<std::unique_ptr<google::protobuf::FileDescriptorProto_const,std::default_delete<google::protobuf::FileDescriptorProto_const>>,std::allocator<std::unique_ptr<google::protobuf::FileDescriptorProto_const,std::default_delete<google::protobuf::FileDescriptorProto_const>>>>
                *)&this->files_to_delete_,__position,&local_18);
  }
  else {
    ((__position._M_current)->_M_t).
    super___uniq_ptr_impl<const_google::protobuf::FileDescriptorProto,_std::default_delete<const_google::protobuf::FileDescriptorProto>_>
    ._M_t.
    super__Tuple_impl<0UL,_const_google::protobuf::FileDescriptorProto_*,_std::default_delete<const_google::protobuf::FileDescriptorProto>_>
    .super__Head_base<0UL,_const_google::protobuf::FileDescriptorProto_*,_false>._M_head_impl = file
    ;
    ppuVar1 = &(this->files_to_delete_).
               super__Vector_base<std::unique_ptr<const_google::protobuf::FileDescriptorProto,_std::default_delete<const_google::protobuf::FileDescriptorProto>_>,_std::allocator<std::unique_ptr<const_google::protobuf::FileDescriptorProto,_std::default_delete<const_google::protobuf::FileDescriptorProto>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + 1;
  }
  bVar2 = DescriptorIndex<const_google::protobuf::FileDescriptorProto_*>::AddFile
                    (&this->index_,local_18,local_18);
  return bVar2;
}

Assistant:

bool SimpleDescriptorDatabase::AddAndOwn(const FileDescriptorProto* file) {
  files_to_delete_.emplace_back(file);
  return index_.AddFile(*file, file);
}